

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O0

int uv__getiovmax(void)

{
  return 0x400;
}

Assistant:

int uv__getiovmax(void) {
#if defined(IOV_MAX)
  return IOV_MAX;
#elif defined(_SC_IOV_MAX)
  static _Atomic int iovmax_cached = -1;
  int iovmax;

  iovmax = atomic_load_explicit(&iovmax_cached, memory_order_relaxed);
  if (iovmax != -1)
    return iovmax;

  /* On some embedded devices (arm-linux-uclibc based ip camera),
   * sysconf(_SC_IOV_MAX) can not get the correct value. The return
   * value is -1 and the errno is EINPROGRESS. Degrade the value to 1.
   */
  iovmax = sysconf(_SC_IOV_MAX);
  if (iovmax == -1)
    iovmax = 1;

  atomic_store_explicit(&iovmax_cached, iovmax, memory_order_relaxed);

  return iovmax;
#else
  return 1024;
#endif
}